

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void rename_cb(uv_fs_t *req)

{
  uv_fs_t *req_local;
  
  if (req != &rename_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x1f8,"req == &rename_req");
    abort();
  }
  if (rename_req.fs_type != UV_FS_RENAME) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x1f9,"req->fs_type == UV_FS_RENAME");
    abort();
  }
  if (rename_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x1fa,"req->result == 0");
    abort();
  }
  rename_cb_count = rename_cb_count + 1;
  uv_fs_req_cleanup(&rename_req);
  return;
}

Assistant:

static void rename_cb(uv_fs_t* req) {
  ASSERT(req == &rename_req);
  ASSERT(req->fs_type == UV_FS_RENAME);
  ASSERT(req->result == 0);
  rename_cb_count++;
  uv_fs_req_cleanup(req);
}